

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::wif_unsigned_long_trace::write
          (wif_unsigned_long_trace *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  char buf [1000];
  
  uVar4 = *this->object;
  uVar1 = (this->super_wif_trace).bit_width;
  if ((uVar4 & ~this->mask) == 0) {
    uVar6 = 1L << ((char)uVar1 - 1U & 0x3f);
    uVar3 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      buf[uVar3] = (uVar4 & uVar6) == 0 ^ 0x31;
      uVar6 = uVar6 >> 1;
    }
  }
  else {
    uVar4 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      buf[uVar4] = '0';
    }
  }
  buf[uVar5] = '\0';
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \"%s\" ;\n",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,buf);
  uVar2 = *this->object;
  this->old_value = uVar2;
  return uVar2;
}

Assistant:

void wif_unsigned_long_trace::write(FILE* f)
{
    char buf[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex]='0';
        }
    }
    else{
        unsigned long bit_mask = 1ul << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    buf[bitindex] = '\0';
    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), buf);
    old_value = object;
}